

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

int __thiscall
QtPrivate::QGenericArrayOps<QMimeMagicRule>::truncate
          (QGenericArrayOps<QMimeMagicRule> *this,char *__file,__off_t __length)

{
  QMimeMagicRule *pQVar1;
  QMimeMagicRule *in_stack_ffffffffffffffd8;
  
  pQVar1 = QArrayDataPointer<QMimeMagicRule>::begin((QArrayDataPointer<QMimeMagicRule> *)0x914541);
  pQVar1 = pQVar1 + (long)__file;
  QArrayDataPointer<QMimeMagicRule>::end((QArrayDataPointer<QMimeMagicRule> *)pQVar1);
  std::destroy<QMimeMagicRule*>(pQVar1,in_stack_ffffffffffffffd8);
  (this->super_QArrayDataPointer<QMimeMagicRule>).size = (qsizetype)__file;
  return (int)this;
}

Assistant:

void truncate(size_t newSize)
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(!this->isShared());
        Q_ASSERT(newSize < size_t(this->size));

        std::destroy(this->begin() + newSize, this->end());
        this->size = newSize;
    }